

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O1

Var Js::JavascriptObject::EntryIsExtensible(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  GlobalObject *this;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  undefined4 *puVar6;
  Var pvVar7;
  GlobalObject *pGVar8;
  GlobalObject *pGVar9;
  long lVar10;
  int in_stack_00000010;
  undefined1 local_40 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != (int)args.super_Arguments.Values) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x3fb,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00cf1d52;
    *puVar6 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_40 = (undefined1  [8])args.super_Arguments.Values;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)local_40,(CallInfo *)&args.super_Arguments.Values);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x3ff,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00cf1d52:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  lVar10 = 0x3f0;
  if (((ulong)local_40 & 0xfffffe) != 0) {
    pvVar7 = Arguments::operator[]((Arguments *)local_40,1);
    BVar4 = JavascriptOperators::IsObject(pvVar7);
    if (BVar4 != 0) {
      pvVar7 = Arguments::operator[]((Arguments *)local_40,1);
      pGVar8 = (GlobalObject *)VarTo<Js::RecyclableObject>(pvVar7);
      iVar5 = (*(pGVar8->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x33])(pGVar8);
      if (iVar5 != 0) {
        this = (((((pGVar8->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.type.
                  ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).globalObject.ptr;
        lVar10 = 1000;
        if (this != (GlobalObject *)0x0 && this != pGVar8) {
          pGVar9 = (GlobalObject *)GlobalObject::ToThis(this);
          if (pGVar9 == pGVar8) {
            iVar5 = (*(this->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.
                      super_FinalizableObject.super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[0x33])(this);
            lVar10 = (ulong)(iVar5 == 0) * 8 + 1000;
          }
        }
      }
    }
  }
  return *(Var *)((long)&(((pSVar1->super_ScriptContextBase).javascriptLibrary)->
                         super_JavascriptLibraryBase).super_FinalizableObject.
                         super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + lVar10);
}

Assistant:

Var JavascriptObject::EntryIsExtensible(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();
    CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(Object_Constructor_isExtensible);

    Assert(!(callInfo.Flags & CallFlags_New));

    if (args.Info.Count < 2 || !JavascriptOperators::IsObject(args[1]))
    {
        return scriptContext->GetLibrary()->GetFalse();
    }

    RecyclableObject *object = VarTo<RecyclableObject>(args[1]);
    BOOL isExtensible = object->IsExtensible();

    GlobalObject* globalObject = object->GetLibrary()->GetGlobalObject();
    if (isExtensible && globalObject != object && globalObject && (globalObject->ToThis() == object))
    {
        isExtensible = globalObject->IsExtensible();
    }

    return scriptContext->GetLibrary()->GetTrueOrFalse(isExtensible);
}